

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzmaEnc.cpp
# Opt level: O0

void crnlib::MovePos(CLzmaEnc *p,UInt32 num)

{
  int in_ESI;
  long in_RDI;
  
  if (in_ESI != 0) {
    *(int *)(in_RDI + 0x32f6c) = in_ESI + *(int *)(in_RDI + 0x32f6c);
    (**(code **)(in_RDI + 0x28))(*(undefined8 *)(in_RDI + 0x30),in_ESI);
  }
  return;
}

Assistant:

static void MovePos(CLzmaEnc* p, UInt32 num) {
#ifdef SHOW_STAT
  ttt += num;
  printf("\n MovePos %d", num);
#endif
  if (num != 0) {
    p->additionalOffset += num;
    p->matchFinder.Skip(p->matchFinderObj, num);
  }
}